

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void datetimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  long lVar1;
  int iVar2;
  int iVar3;
  sqlite3_context *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int n;
  int s;
  int Y;
  DateTime x;
  char zBuf [32];
  _func_void_void_ptr *in_stack_ffffffffffffff78;
  int n_00;
  undefined4 in_stack_ffffffffffffff98;
  sqlite3_context *in_stack_ffffffffffffffa8;
  int local_50;
  double local_38;
  byte local_2c;
  
  iVar2 = (int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&stack0xffffffffffffffa8,&DAT_002af5b0,0x30);
  iVar2 = isDate(in_stack_ffffffffffffffa8,iVar2,
                 (sqlite3_value **)CONCAT44(in_ESI,in_stack_ffffffffffffff98),(DateTime *)in_RDX);
  if (iVar2 == 0) {
    computeYMD_HMS((DateTime *)0x22b7b3);
    iVar2 = local_50;
    if (local_50 < 0) {
      iVar2 = -local_50;
    }
    if ((local_2c >> 2 & 1) == 0) {
      iVar3 = (int)local_38;
      n_00 = 0x14;
    }
    else {
      iVar3 = (int)(local_38 * 1000.0 + 0.5);
      n_00 = 0x18;
    }
    if (local_50 < 0) {
      sqlite3_result_text(in_RDX,(char *)CONCAT44(iVar2,iVar3),n_00,in_stack_ffffffffffffff78);
    }
    else {
      sqlite3_result_text(in_RDX,(char *)CONCAT44(iVar2,iVar3),n_00,in_stack_ffffffffffffff78);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void datetimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y, s, n;
    char zBuf[32];
    computeYMD_HMS(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = ' ';
    zBuf[12] = '0' + (x.h/10)%10;
    zBuf[13] = '0' + (x.h)%10;
    zBuf[14] = ':';
    zBuf[15] = '0' + (x.m/10)%10;
    zBuf[16] = '0' + (x.m)%10;
    zBuf[17] = ':';
    if( x.useSubsec ){
      s = (int)(1000.0*x.s + 0.5);
      zBuf[18] = '0' + (s/10000)%10;
      zBuf[19] = '0' + (s/1000)%10;
      zBuf[20] = '.';
      zBuf[21] = '0' + (s/100)%10;
      zBuf[22] = '0' + (s/10)%10;
      zBuf[23] = '0' + (s)%10;
      zBuf[24] = 0;
      n = 24;
    }else{
      s = (int)x.s;
      zBuf[18] = '0' + (s/10)%10;
      zBuf[19] = '0' + (s)%10;
      zBuf[20] = 0;
      n = 20;
    }
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, n, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], n-1, SQLITE_TRANSIENT);
    }
  }
}